

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_perform_ehlo(Curl_easy *data)

{
  byte *pbVar1;
  connectdata *pcVar2;
  CURLcode CVar3;
  
  pcVar2 = data->conn;
  *(undefined2 *)((long)&pcVar2->proto + 0xb8) = 0;
  *(undefined2 *)((long)&pcVar2->proto + 0xbc) = 0;
  pbVar1 = (byte *)((long)&pcVar2->proto + 0xd0);
  *pbVar1 = *pbVar1 & 0xed;
  CVar3 = Curl_pp_sendf(data,&(pcVar2->proto).ftpc.pp,"EHLO %s",(pcVar2->proto).ftpc.newhost);
  if (CVar3 == CURLE_OK) {
    smtp_state(data,SMTP_EHLO);
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_perform_ehlo(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  smtpc->sasl.authmechs = SASL_AUTH_NONE; /* No known auth. mechanism yet */
  smtpc->sasl.authused = SASL_AUTH_NONE;  /* Clear the authentication mechanism
                                             used for esmtp connections */
  smtpc->tls_supported = FALSE;           /* Clear the TLS capability */
  smtpc->auth_supported = FALSE;          /* Clear the AUTH capability */

  /* Send the EHLO command */
  result = Curl_pp_sendf(data, &smtpc->pp, "EHLO %s", smtpc->domain);

  if(!result)
    smtp_state(data, SMTP_EHLO);

  return result;
}